

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionAccess
          (ExpressionContext *ctx,SynBase *source,FunctionLookupChain chain,ExprBase *context)

{
  TypeBase *pTVar1;
  Node *pNVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeFunctionSet *pTVar5;
  ExprFunctionAccess *this;
  SynBase *source_00;
  undefined4 extraout_var_02;
  ulong uVar6;
  ExprBase *pEVar7;
  ArrayView<TypeBase_*> setTypes;
  SmallArray<TypeBase_*,_16U> types;
  IntrusiveList<FunctionHandle> local_128;
  undefined1 local_118 [16];
  ScopeData *local_108;
  ExprBase *local_f8;
  ScopeData *local_f0;
  FunctionData *local_e8;
  FunctionLookupChain local_e0;
  SmallArray<TypeBase_*,_16U> local_c8;
  FunctionHandle *pFVar4;
  undefined4 extraout_var_01;
  
  this = (ExprFunctionAccess *)local_118;
  anon_unknown.dwarf_9fd58::FunctionLookupChain::next((FunctionLookupChain *)this,&chain);
  pNVar2 = chain.node.node;
  pEVar7 = (ExprBase *)local_118._8_8_;
  if ((ExprBase *)local_118._8_8_ != (ExprBase *)0x0) {
    local_c8.allocator = ctx->allocator;
    local_128.head = (FunctionHandle *)0x0;
    local_128.tail = (FunctionHandle *)0x0;
    local_c8.data = local_c8.little;
    local_c8.count = 0;
    local_c8.max = 0x10;
    if (local_c8.data == (TypeBase **)0x0) {
LAB_00152bcf:
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                   );
    }
    local_f8 = (ExprBase *)local_118._8_8_;
    local_c8.little[0] = *(TypeBase **)(*(long *)(chain.node.node + 0x10) + 0x28);
    local_c8.count = 1;
    local_f0 = (ScopeData *)context;
    local_e8 = (FunctionData *)source;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
    pFVar4 = (FunctionHandle *)CONCAT44(extraout_var,iVar3);
    pFVar4->function = *(FunctionData **)(pNVar2 + 0x10);
    pFVar4->next = (FunctionHandle *)0x0;
    pFVar4->listed = false;
    IntrusiveList<FunctionHandle>::push_back(&local_128,pFVar4);
    if ((ExprBase *)local_118._8_8_ != (ExprBase *)0x0) {
      do {
        pTVar1 = (TypeBase *)((*(SynBase **)(local_118._8_8_ + 0x10))->pos).end;
        if (local_c8.count == local_c8.max) {
          SmallArray<TypeBase_*,_16U>::grow(&local_c8,local_c8.count);
        }
        if (local_c8.data == (TypeBase **)0x0) goto LAB_00152bcf;
        uVar6 = (ulong)local_c8.count;
        local_c8.count = local_c8.count + 1;
        local_c8.data[uVar6] = pTVar1;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pFVar4 = (FunctionHandle *)CONCAT44(extraout_var_00,iVar3);
        pFVar4->function = *(FunctionData **)(local_118._8_8_ + 0x10);
        pFVar4->next = (FunctionHandle *)0x0;
        pFVar4->listed = false;
        IntrusiveList<FunctionHandle>::push_back(&local_128,pFVar4);
        anon_unknown.dwarf_9fd58::FunctionLookupChain::next
                  (&local_e0,(FunctionLookupChain *)local_118);
        local_108 = local_e0.scope;
        local_118._8_8_ = local_e0.node.node;
        local_118._0_8_ = local_e0.node.start;
      } while ((ExprBase *)local_e0.node.node != (ExprBase *)0x0);
    }
    setTypes.count = local_c8.count;
    setTypes.data = local_c8.data;
    setTypes._12_4_ = 0;
    pTVar5 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    source = (SynBase *)local_e8;
    context = (ExprBase *)local_f0;
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_01,iVar3);
    (this->super_ExprBase).typeID = 0x27;
    (this->super_ExprBase).source = (SynBase *)local_e8;
    (this->super_ExprBase).type = &pTVar5->super_TypeBase;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229e80;
    this->function = (FunctionData *)local_128.head;
    this->context = (ExprBase *)local_128.tail;
    this[1].super_ExprBase._vptr_ExprBase = (_func_int **)local_f0;
    SmallArray<TypeBase_*,_16U>::~SmallArray(&local_c8);
    pEVar7 = local_f8;
  }
  if (pEVar7 == (ExprBase *)0x0) {
    if ((ScopeData *)context == (ScopeData *)0x0) {
      source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      context = CreateFunctionContextAccess
                          (ctx,source_00,*(FunctionData **)(chain.node.node + 0x10));
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_02,iVar3);
    ExprFunctionAccess::ExprFunctionAccess
              (this,source,&(*(FunctionData **)(chain.node.node + 0x10))->type->super_TypeBase,
               *(FunctionData **)(chain.node.node + 0x10),context);
  }
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateFunctionAccess(ExpressionContext &ctx, SynBase *source, FunctionLookupChain chain, ExprBase *context)
{
	if(FunctionLookupChain curr = chain.next())
	{
		SmallArray<TypeBase*, 16> types(ctx.allocator);
		IntrusiveList<FunctionHandle> functions;

		types.push_back(chain->type);
		functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(*chain));

		while(curr)
		{
			types.push_back(curr->type);
			functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(*curr));

			curr = curr.next();
		}

		TypeFunctionSet *type = ctx.GetFunctionSetType(types);

		return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, context);
	}

	if(!context)
		context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), *chain);

	return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, chain->type, *chain, context);
}